

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O3

Config * __thiscall QPDFJob::Config::copyEncryption(Config *this,string *parameter)

{
  element_type *peVar1;
  
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->encryption_file);
  peVar1 = (this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1->copy_encryption = true;
  peVar1->encrypt = false;
  peVar1->decrypt = false;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::copyEncryption(std::string const& parameter)
{
    o.m->encryption_file = parameter;
    o.m->copy_encryption = true;
    o.m->encrypt = false;
    o.m->decrypt = false;
    return this;
}